

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_rff.cpp
# Opt level: O0

int __thiscall FRFFLump::FillCache(FRFFLump *this)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int local_24;
  int i;
  BYTE *data;
  int cryptlen;
  int res;
  FRFFLump *this_local;
  
  iVar2 = FUncompressedLump::FillCache(&this->super_FUncompressedLump);
  if (((this->super_FUncompressedLump).super_FResourceLump.Flags & 8) != 0) {
    iVar3 = MIN<int>((this->super_FUncompressedLump).super_FResourceLump.LumpSize,0x100);
    pcVar1 = (this->super_FUncompressedLump).super_FResourceLump.Cache;
    for (local_24 = 0; local_24 < iVar3; local_24 = local_24 + 1) {
      pcVar1[local_24] = pcVar1[local_24] ^ (byte)(local_24 >> 1);
    }
  }
  return iVar2;
}

Assistant:

int FRFFLump::FillCache()
{
	int res = FUncompressedLump::FillCache();

	if (Flags & LUMPF_BLOODCRYPT)
	{
		int cryptlen = MIN<int> (LumpSize, 256);
		BYTE *data = (BYTE *)Cache;
		
		for (int i = 0; i < cryptlen; ++i)
		{
			data[i] ^= i >> 1;
		}
	}
	return res;
}